

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chr.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  char *pcVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ostream *poVar21;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  double *pdVar25;
  void *pvVar26;
  void *pvVar27;
  ulong *puVar28;
  long in_RSI;
  int in_EDI;
  ulong uVar29;
  double *in_stack_00000268;
  int i_7;
  int i_6;
  int *in_stack_00000278;
  double *in_stack_00000280;
  int *in_stack_00000288;
  int *in_stack_00000290;
  double *p_value_poisbinom;
  int k_2;
  string *in_stack_000002a0;
  int i_5;
  int idx;
  double *p;
  double *p_value_dp;
  double eta;
  int in_stack_000002c8;
  int N_intersect;
  int m;
  int n;
  string id_1;
  int i_4;
  int i_3;
  string id;
  int i_2;
  thread *th;
  double *eta_chr;
  int *NI;
  int *m_chr;
  int *n_chr;
  int k_1;
  int i_1;
  double **NM;
  int k;
  int i;
  double **Pj;
  int max_m_chr;
  int num_chr;
  string thread_mode;
  string resultpath;
  int scale;
  string chrom_size_path;
  string reference_path;
  string query_path;
  size_t *in_stack_fffffffffffffa68;
  thread *__t;
  string *in_stack_fffffffffffffa70;
  string *in_stack_fffffffffffffa78;
  string *in_stack_fffffffffffffa80;
  undefined4 uVar30;
  undefined8 in_stack_fffffffffffffab0;
  double *in_stack_fffffffffffffab8;
  double *in_stack_fffffffffffffac0;
  ulong *local_530;
  double **in_stack_fffffffffffffad8;
  ulong *puVar31;
  int *in_stack_fffffffffffffae0;
  int **in_stack_fffffffffffffae8;
  double **in_stack_fffffffffffffaf0;
  int **in_stack_fffffffffffffaf8;
  int **in_stack_fffffffffffffb00;
  _func_void_int_ptr_int_ptr_double_ptr_int_ptr_double_ptr_double_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_int
  *in_stack_fffffffffffffb08;
  thread *in_stack_fffffffffffffb10;
  double **in_stack_fffffffffffffb50;
  double **in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  int *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  int *in_stack_fffffffffffffb88;
  ulong *local_400;
  int local_328;
  int in_stack_fffffffffffffcdc;
  double *in_stack_fffffffffffffce0;
  double *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [36];
  int local_1dc;
  int local_1d8;
  int local_1d4;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [36];
  int local_164;
  ulong *local_160;
  thread local_158;
  int *local_150;
  int *local_148;
  int *local_140;
  int local_138;
  int local_134;
  void *local_130;
  int local_128;
  int local_124;
  void *local_120;
  int local_114;
  int local_110;
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  int local_98;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_4f96);
  if (local_8 < 7) {
    std::operator<<((ostream *)&std::cout,
                    "Usage:\n\tistat <QUERY_INTERVALS_FILE> <REFERENCE_INTERVALS_FILE> <CHROMOSOME_SIZES_FILE>\n\t<SCALING_FACTOR> <OUTPUT_FILE> <THREADING_MODE>\n\nDescription:\n\tComputes the p-value of overlap between query and reference intervals.\n"
                   );
    local_4 = 1;
  }
  else {
    pcVar2 = *(char **)(local_10 + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar2,&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    pcVar2 = *(char **)(local_10 + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar2,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    pcVar2 = *(char **)(local_10 + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar2,&local_91);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    pcVar2 = *(char **)(local_10 + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,pcVar2,&local_b9);
    iVar17 = std::__cxx11::stoi((string *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,0);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    pcVar2 = *(char **)(local_10 + 0x28);
    local_98 = iVar17;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,pcVar2,&local_e1);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    pcVar2 = *(char **)(local_10 + 0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,pcVar2,&local_109);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    local_110 = 0x18;
    poVar21 = std::operator<<((ostream *)&std::cout,"scale is ");
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,local_98);
    std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
    local_114 = 100000;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)(local_110 + 1);
    uVar22 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar22 = 0xffffffffffffffff;
    }
    local_120 = operator_new__(uVar22);
    for (local_124 = 0; local_124 <= local_110; local_124 = local_124 + 1) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (long)local_114;
      uVar22 = SUB168(auVar5 * ZEXT816(8),0);
      if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
        uVar22 = 0xffffffffffffffff;
      }
      pvVar23 = operator_new__(uVar22);
      *(void **)((long)local_120 + (long)local_124 * 8) = pvVar23;
      for (local_128 = 0; local_128 < local_114; local_128 = local_128 + 1) {
        *(undefined8 *)(*(long *)((long)local_120 + (long)local_124 * 8) + (long)local_128 * 8) = 0;
      }
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)(local_110 + 1);
    uVar22 = SUB168(auVar6 * ZEXT816(8),0);
    if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
      uVar22 = 0xffffffffffffffff;
    }
    local_130 = operator_new__(uVar22);
    for (local_134 = 0; local_134 <= local_110; local_134 = local_134 + 1) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (long)local_114;
      uVar22 = SUB168(auVar7 * ZEXT816(8),0);
      if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
        uVar22 = 0xffffffffffffffff;
      }
      pvVar23 = operator_new__(uVar22);
      *(void **)((long)local_130 + (long)local_134 * 8) = pvVar23;
      for (local_138 = 0; local_138 < local_114; local_138 = local_138 + 1) {
        *(undefined8 *)(*(long *)((long)local_130 + (long)local_134 * 8) + (long)local_138 * 8) =
             0xbff0000000000000;
      }
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (long)(local_110 + 1);
    uVar22 = SUB168(auVar8 * ZEXT816(4),0);
    if (SUB168(auVar8 * ZEXT816(4),8) != 0) {
      uVar22 = 0xffffffffffffffff;
    }
    local_140 = (int *)operator_new__(uVar22);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (long)(local_110 + 1);
    uVar22 = SUB168(auVar9 * ZEXT816(4),0);
    if (SUB168(auVar9 * ZEXT816(4),8) != 0) {
      uVar22 = 0xffffffffffffffff;
    }
    local_148 = (int *)operator_new__(uVar22);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (long)(local_110 + 1);
    uVar22 = SUB168(auVar10 * ZEXT816(4),0);
    if (SUB168(auVar10 * ZEXT816(4),8) != 0) {
      uVar22 = 0xffffffffffffffff;
    }
    local_150 = (int *)operator_new__(uVar22);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (long)(local_110 + 1);
    uVar22 = SUB168(auVar11 * ZEXT816(8),0);
    if (SUB168(auVar11 * ZEXT816(8),8) != 0) {
      uVar22 = 0xffffffffffffffff;
    }
    local_158._M_id._M_thread = (id)operator_new__(uVar22);
    uVar22 = (ulong)local_110;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar22;
    uVar24 = SUB168(auVar12 * ZEXT816(8),0);
    uVar29 = uVar24 + 8;
    if (0xfffffffffffffff7 < uVar24) {
      uVar29 = 0xffffffffffffffff;
    }
    if (SUB168(auVar12 * ZEXT816(8),8) != 0) {
      uVar29 = 0xffffffffffffffff;
    }
    local_160 = (ulong *)operator_new__(uVar29);
    *local_160 = uVar22;
    local_160 = local_160 + 1;
    if (uVar22 != 0) {
      local_400 = local_160;
      do {
        std::thread::thread((thread *)0x10bcb3);
        local_400 = local_400 + 1;
      } while (local_400 != local_160 + uVar22);
    }
    bVar16 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
    if (bVar16) {
      for (local_164 = 0; local_164 < local_110; local_164 = local_164 + 1) {
        std::__cxx11::string::string(local_188);
        if (local_164 == 0x16) {
          std::__cxx11::string::operator=(local_188,"chrX");
        }
        else if (local_164 == 0x17) {
          std::__cxx11::string::operator=(local_188,"chrY");
        }
        else {
          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffab8 >> 0x20));
          std::operator+((char *)in_stack_fffffffffffffa78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa70);
          std::__cxx11::string::operator=(local_188,local_1a8);
          std::__cxx11::string::~string(local_1a8);
          std::__cxx11::string::~string(local_1c8);
        }
        local_1d4 = local_164 + 1;
        in_stack_fffffffffffffa70 = (string *)((long)local_120 + (long)local_164 * 8 + 8);
        in_stack_fffffffffffffa80 = local_68;
        in_stack_fffffffffffffa78 = local_30;
        __t = &local_158;
        std::thread::
        thread<void(&)(int*,int*,double*,int*,double*,double*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string,int),int*&,int*&,double*&,int*&,double*&,double*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int,std::__cxx11::string&,int&,void>
                  (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                   in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   in_stack_fffffffffffffb50,in_stack_fffffffffffffb58,in_stack_fffffffffffffb60,
                   in_stack_fffffffffffffb68,in_stack_fffffffffffffb70,in_stack_fffffffffffffb78,
                   in_stack_fffffffffffffb80,in_stack_fffffffffffffb88);
        std::thread::operator=((thread *)in_stack_fffffffffffffa70,__t);
        std::thread::~thread((thread *)0x10bf27);
        std::__cxx11::string::~string(local_188);
      }
      for (local_1d8 = 0; iVar17 = (int)((ulong)in_stack_fffffffffffffab0 >> 0x20),
          local_1d8 < local_110; local_1d8 = local_1d8 + 1) {
        std::thread::join();
      }
    }
    else {
      for (local_1dc = 1; iVar17 = (int)((ulong)in_stack_fffffffffffffab0 >> 0x20),
          local_1dc <= local_110; local_1dc = local_1dc + 1) {
        std::__cxx11::string::string(local_200);
        uVar30 = (undefined4)((ulong)in_stack_fffffffffffffa80 >> 0x20);
        if (local_1dc == 0x17) {
          std::__cxx11::string::operator=(local_200,"chrX");
        }
        else if (local_1dc == 0x18) {
          std::__cxx11::string::operator=(local_200,"chrY");
        }
        else {
          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffab8 >> 0x20));
          std::operator+((char *)in_stack_fffffffffffffa78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa70);
          std::__cxx11::string::operator=(local_200,local_220);
          std::__cxx11::string::~string(local_220);
          std::__cxx11::string::~string(local_240);
        }
        std::__cxx11::string::string(local_260,local_30);
        std::__cxx11::string::string(local_280,local_68);
        std::__cxx11::string::string(local_2a0,local_90);
        iVar17 = local_1dc;
        std::__cxx11::string::string(local_2c0,local_200);
        in_stack_fffffffffffffa80 = (string *)CONCAT44(uVar30,iVar17);
        in_stack_fffffffffffffa78 = local_2a0;
        in_stack_fffffffffffffa70 = local_280;
        chrom(in_stack_00000290,in_stack_00000288,in_stack_00000280,in_stack_00000278,_i_7,
              in_stack_00000268,in_stack_000002a0,_i_5,(string *)p,(int)p_value_dp,(string *)eta,
              in_stack_000002c8);
        std::__cxx11::string::~string(local_2c0);
        std::__cxx11::string::~string(local_2a0);
        std::__cxx11::string::~string(local_280);
        std::__cxx11::string::~string(local_260);
        std::__cxx11::string::~string(local_200);
      }
    }
    iVar18 = sum(local_140,local_110);
    iVar19 = sum(local_148,local_110);
    iVar20 = sum(local_150,local_110);
    poVar21 = std::operator<<((ostream *)&std::cout,"Number of query intervals (n) is ");
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar18);
    std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
    poVar21 = std::operator<<((ostream *)&std::cout,"Number of reference intervals (m) is ");
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar19);
    std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
    poVar21 = std::operator<<((ostream *)&std::cout,"Overlap is ");
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar20);
    std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
    pdVar25 = std::min_element<double*>
                        ((double *)in_stack_fffffffffffffa80,(double *)in_stack_fffffffffffffa78);
    dVar1 = *pdVar25;
    poVar21 = std::operator<<((ostream *)&std::cout,"eta is ");
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,dVar1);
    std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (long)(iVar19 + 1);
    uVar22 = SUB168(auVar13 * ZEXT816(8),0);
    if (SUB168(auVar13 * ZEXT816(8),8) != 0) {
      uVar22 = 0xffffffffffffffff;
    }
    pvVar23 = operator_new__(uVar22);
    combine_chr((double *)in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20),
                (int)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    poVar21 = std::operator<<((ostream *)&std::cout,"DP p-value is ");
    poVar21 = (ostream *)
              std::ostream::operator<<(poVar21,*(double *)((long)pvVar23 + (long)iVar20 * 8));
    std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (long)(iVar19 + 1);
    uVar22 = SUB168(auVar14 * ZEXT816(8),0);
    if (SUB168(auVar14 * ZEXT816(8),8) != 0) {
      uVar22 = 0xffffffffffffffff;
    }
    pvVar26 = operator_new__(uVar22);
    local_2ec = 0;
    for (local_2f0 = 1; local_2f0 <= local_110; local_2f0 = local_2f0 + 1) {
      for (local_2f4 = 1; local_2f4 <= local_148[local_2f0]; local_2f4 = local_2f4 + 1) {
        *(undefined8 *)((long)pvVar26 + (long)(local_2ec + local_2f4) * 8) =
             *(undefined8 *)(*(long *)((long)local_120 + (long)local_2f0 * 8) + (long)local_2f4 * 8)
        ;
      }
      local_2ec = local_148[local_2f0] + local_2ec;
    }
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (long)(iVar19 + 1);
    uVar22 = SUB168(auVar15 * ZEXT816(8),0);
    if (SUB168(auVar15 * ZEXT816(8),8) != 0) {
      uVar22 = 0xffffffffffffffff;
    }
    pvVar27 = operator_new__(uVar22);
    poisbinom(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,iVar17);
    poVar21 = std::operator<<((ostream *)&std::cout,"PB p-value is ");
    poVar21 = (ostream *)
              std::ostream::operator<<(poVar21,*(double *)((long)pvVar27 + (long)iVar20 * 8));
    std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string((string *)&stack0xfffffffffffffce0,local_e0);
    write2file(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
               in_stack_fffffffffffffcdc);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffce0);
    for (iVar17 = 0; iVar17 <= local_110; iVar17 = iVar17 + 1) {
      pvVar3 = *(void **)((long)local_120 + (long)iVar17 * 8);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
    }
    if (local_120 != (void *)0x0) {
      operator_delete__(local_120);
    }
    for (local_328 = 0; local_328 <= local_110; local_328 = local_328 + 1) {
      pvVar3 = *(void **)((long)local_130 + (long)local_328 * 8);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
    }
    if (local_130 != (void *)0x0) {
      operator_delete__(local_130);
    }
    if (local_140 != (int *)0x0) {
      operator_delete__(local_140);
    }
    if (local_148 != (int *)0x0) {
      operator_delete__(local_148);
    }
    if (local_150 != (int *)0x0) {
      operator_delete__(local_150);
    }
    if (local_158._M_id._M_thread != 0) {
      operator_delete__((void *)local_158._M_id._M_thread);
    }
    if (local_160 != (ulong *)0x0) {
      puVar28 = local_160 + -1;
      local_530 = local_160 + local_160[-1];
      puVar31 = local_160;
      if (local_160 != local_530) {
        do {
          local_530 = local_530 + -1;
          std::thread::~thread((thread *)0x10ca0b);
        } while (local_530 != puVar31);
      }
      operator_delete__(puVar28);
    }
    if (pvVar23 != (void *)0x0) {
      operator_delete__(pvVar23);
    }
    if (pvVar26 != (void *)0x0) {
      operator_delete__(pvVar26);
    }
    if (pvVar27 != (void *)0x0) {
      operator_delete__(pvVar27);
    }
    local_4 = 0;
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_30);
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    cout << HEADER;

    if (argc < 7)
    {
        cout << USAGE;
        return 1;
    }
    string query_path = argv[1];
    string reference_path = argv[2];
    string chrom_size_path = argv[3];
    int scale = stoi(argv[4]);
    string resultpath = argv[5];
    string thread_mode = argv[6];
    int num_chr = 24;
    cout << "scale is " << scale << endl;
    int max_m_chr = 100000;
    double** Pj;
    Pj = new double* [num_chr+1];
    for(int i=0; i<=num_chr; i++)
    {
        Pj[i] = new double [max_m_chr];
        for(int k=0; k<max_m_chr; k++)
        {
            Pj[i][k] = 0;
        }
    }

    double** NM; //log scale
    NM = new double* [num_chr+1];
    for(int i=0; i<=num_chr; i++)
    {
        NM[i] = new double [max_m_chr];
        for(int k=0; k<max_m_chr; k++)
            {
                NM[i][k] = -1;
            }
    }

    int* n_chr = new int [num_chr+1];
    int* m_chr = new int [num_chr+1];
    int* NI = new int [num_chr+1];
    double* eta_chr = new double [num_chr+1];

    thread *th = new thread [num_chr];

    if (thread_mode=="p")
    {//Mltithreading
        for(int i=0; i<num_chr; i++)
        {
            string id;
            if (i+1==23)
                id = "chrX";
            else if (i+1==24)
                id = "chrY";
            else
                id = "chr" + to_string(i+1);
            th[i] = thread(call_from_thread, n_chr, m_chr, NM[i+1], NI, eta_chr, Pj[i+1],
                           query_path, reference_path, chrom_size_path, i+1, id, scale);
        }
        for(int i=0; i<num_chr; i++)
        {
            th[i].join();
        }
    }
    else
    {// Single thread
        for(int i=1; i<=num_chr; i++)
        {
            string id;
            if (i==23)
                id = "chrX";
            else if (i==24)
                id = "chrY";
            else
                id = "chr" + to_string(i);
            chrom(n_chr, m_chr, NM[i], NI, eta_chr, Pj[i], query_path, reference_path, chrom_size_path,
                          i, id, scale);
        }
    }
    // int job_id[8] = {0, 1, 2, 3, 4, 5, 6, num_chr-1};
    // for (int j=0; j<num_chr/8; j++)
    // {
    //     for(auto i: job_id)
    //     {
    //         string id;
    //         if (i+1==23)
    //             id = "chrX";
    //         else if (i+1==24)
    //             id = "chrY";
    //         else
    //             id = "chr" + to_string(i+1);
    //         th[i] = thread(call_from_thread, n_chr, m_chr, NM[i+1], NI, Pj[i+1],
    //                        query_path, reference_path, chrom_size_path, i+1, id, scale);
    //     }
    //     for(auto i: job_id)
    //     {
    //         th[i].join();
    //     }
    //     job_id[0] += 7;
    //     job_id[1] += 7;
    //     job_id[2] += 7;
    //     job_id[3] += 7;
    //     job_id[4] += 7;
    //     job_id[5] += 7;
    //     job_id[6] += 7;
    //     job_id[7]--;
    // }

    int n = sum(n_chr, num_chr);
    int m = sum(m_chr, num_chr);
    int N_intersect = sum(NI, num_chr);
    cout << "Number of query intervals (n) is " << n << endl;
    cout << "Number of reference intervals (m) is " << m << endl;
    cout << "Overlap is " << N_intersect << endl;

    // int mid = num_chr/2;
    // nth_element(eta_chr+1, eta_chr+1+mid, eta_chr+num_chr+1);
    // double eta = eta_chr[1+mid];
    double eta = *min_element(eta_chr+1, eta_chr+num_chr+1);
    cout << "eta is " << eta << endl;

    double* p_value_dp = new double [m+1];
    combine_chr(p_value_dp, m, num_chr, m_chr, NM);
    cout << "DP p-value is " << p_value_dp[N_intersect] << endl;

    double* p = new double [m+1];
    int idx = 0;
    for(int i=1; i<=num_chr; i++)
    {
      for(int k=1; k<=m_chr[i]; k++)
      {
        p[idx+k] = Pj[i][k];
      }
      idx += m_chr[i];
    }
    double* p_value_poisbinom = new double [m+1];
    poisbinom(p_value_poisbinom, p, m);
    cout << "PB p-value is " << p_value_poisbinom[N_intersect] << endl;

    // write2file(resultpath, p_value_dp, p_value_poisbinom, m);
    write2file(resultpath, p_value_dp, p_value_poisbinom, m);

    for(int i=0; i<=num_chr; i++)
    {
        delete [] Pj[i];
    }
    delete [] Pj;
    for(int i=0; i<=num_chr; i++)
    {
        delete [] NM[i];
    }
    delete [] NM;
    delete [] n_chr;
    delete [] m_chr;
    delete [] NI;
    delete [] eta_chr;
    delete [] th;
    delete [] p_value_dp;
    delete [] p;
    delete [] p_value_poisbinom;
    return 0;
}